

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt.cpp
# Opt level: O2

void __thiscall grib2dec_demo::Txt::setComponent(Txt *this,G2DEC_Message *message)

{
  double *pdVar1;
  ostream *poVar2;
  int j;
  int iVar3;
  long lVar4;
  int iVar5;
  
  poVar2 = std::operator<<((this->super_Output).out,"Parameter id: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,message->parameter);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((this->super_Output).out,"Latitude: [");
  poVar2 = std::ostream::_M_insert<double>((message->grid).lat1);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>((message->grid).lat2);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>((message->grid).latInc);
  poVar2 = std::operator<<(poVar2,"]");
  std::operator<<(poVar2,", Longitude: [");
  poVar2 = std::ostream::_M_insert<double>((message->grid).lon1);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>((message->grid).lon2);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>((message->grid).lonInc);
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar4 = 0;
  for (iVar3 = 0; iVar3 < (message->grid).nj; iVar3 = iVar3 + 1) {
    lVar4 = (long)(int)lVar4;
    for (iVar5 = 0; iVar5 < (message->grid).ni; iVar5 = iVar5 + 1) {
      pdVar1 = message->values + lVar4;
      lVar4 = lVar4 + 1;
      poVar2 = std::ostream::_M_insert<double>(*pdVar1);
      std::operator<<(poVar2," ");
    }
    std::endl<char,std::char_traits<char>>((this->super_Output).out);
  }
  return;
}

Assistant:

void Txt::setComponent(const G2DEC_Message& message)
{
    const G2DEC_Grid& grid = message.grid;

    out << "Parameter id: " << message.parameter << endl;
    out << "Latitude: [" << grid.lat1 << ", " << grid.lat2 << ", " << grid.latInc << "]"
        << ", Longitude: [" << grid.lon1 << ", " << grid.lon2 << ", " << grid.lonInc << "]"
        << endl;

    int n = 0;
    for (int j = 0; j < grid.nj; j++) {
        for (int i = 0; i < grid.ni; i++)
            out << message.values[n++] << " ";
        out << endl;
    }
}